

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O3

TypedDeleter<LLVMBC::NamedMDNode> * __thiscall
LLVMBC::LLVMContext::
construct_trivial<LLVMBC::LLVMContext::TypedDeleter<LLVMBC::NamedMDNode>,LLVMBC::NamedMDNode*&>
          (LLVMContext *this,NamedMDNode **u)

{
  NamedMDNode *pNVar1;
  TypedDeleter<LLVMBC::NamedMDNode> *pTVar2;
  
  pTVar2 = (TypedDeleter<LLVMBC::NamedMDNode> *)allocate(this,0x10,8);
  if (pTVar2 != (TypedDeleter<LLVMBC::NamedMDNode> *)0x0) {
    pNVar1 = *u;
    (pTVar2->super_Deleter)._vptr_Deleter = (_func_int **)&PTR__Deleter_001f33c0;
    pTVar2->ptr = pNVar1;
    return pTVar2;
  }
  std::terminate();
}

Assistant:

T *construct_trivial(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);
		return t;
	}